

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O1

int re_doreplace(RSIZE plen,char *st)

{
  byte bVar1;
  line *plVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  uint uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  byte local_138 [8];
  char repstr [256];
  
  plVar2 = curwp->w_dotp;
  uVar6 = 0;
  uVar5 = 0;
  iVar3 = 0;
  repstr._252_4_ = plen;
  do {
    bVar1 = *st;
    uVar4 = (uint)bVar1;
    if (uVar6 == 2) {
      if ((byte)(bVar1 - 0x30) < 10) {
        uVar5 = (uVar4 + uVar5 * 10) - 0x30;
LAB_00115b59:
        uVar6 = 2;
        goto LAB_00115c1d;
      }
      if (9 < (int)uVar5) {
        return 0;
      }
      __n = (long)regex_match[(int)uVar5].rm_eo - (long)regex_match[(int)uVar5].rm_so;
      iVar7 = (int)__n + iVar3;
      if (0xff < iVar7) {
        return 0;
      }
      memmove(local_138 + iVar3,plVar2->l_text + regex_match[(int)uVar5].rm_so,__n);
      bVar1 = *st;
      bVar8 = bVar1 != 0;
      if (bVar1 == 0x5c) {
        uVar6 = 1;
      }
      else {
        local_138[iVar7] = bVar1;
        if (iVar7 == 0xff) {
          return 0;
        }
        iVar7 = iVar7 + 1;
        uVar6 = 0;
      }
      st = (char *)((byte *)st + 1);
      iVar3 = iVar7;
    }
    else {
      if (uVar6 == 1) {
        if ((byte)(bVar1 - 0x30) < 10) {
          uVar5 = (uint)(byte)(bVar1 - 0x30);
          goto LAB_00115b59;
        }
        if (bVar1 == 0) {
          uVar4 = 1;
          goto LAB_00115c46;
        }
        local_138[iVar3] = bVar1;
        if (0xfe < iVar3) {
          return 0;
        }
LAB_00115c16:
        iVar3 = iVar3 + 1;
        uVar6 = 0;
      }
      else {
        if (bVar1 == 0) {
LAB_00115c46:
          bVar8 = false;
          uVar6 = uVar4;
          goto LAB_00115c48;
        }
        if (uVar4 != 0x5c) {
          local_138[iVar3] = bVar1;
          if (0xfe < iVar3) {
            return 0;
          }
          goto LAB_00115c16;
        }
        uVar6 = 1;
      }
LAB_00115c1d:
      st = (char *)((byte *)st + 1);
      bVar8 = true;
    }
LAB_00115c48:
    if (!bVar8) {
      local_138[iVar3] = 0;
      iVar3 = lreplace(repstr._252_4_,(char *)local_138);
      return iVar3;
    }
  } while( true );
}

Assistant:

static int
re_doreplace(RSIZE plen, char *st)
{
	int	 j, k, s, more, num, state;
	struct line	*clp;
	char	 repstr[REPLEN];

	clp = curwp->w_dotp;
	more = TRUE;
	j = 0;
	state = 0;
	num = 0;

	/* The following FSA parses the replacement string */
	while (more) {
		switch (state) {
		case 0:
			if (*st == '\\') {
				st++;
				state = 1;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
			}
			break;
		case 1:
			if (*st >= '0' && *st <= '9') {
				num = *st - '0';
				st++;
				state = 2;
			} else if (*st == '\0')
				more = FALSE;
			else {
				repstr[j] = *st;
				j++;
				if (j >= REPLEN)
					return (FALSE);
				st++;
				state = 0;
			}
			break;
		case 2:
			if (*st >= '0' && *st <= '9') {
				num = 10 * num + *st - '0';
				st++;
			} else {
				if (num >= RE_NMATCH)
					return (FALSE);
				k = regex_match[num].rm_eo - regex_match[num].rm_so;
				if (j + k >= REPLEN)
					return (FALSE);
				bcopy(&(clp->l_text[regex_match[num].rm_so]),
				    &repstr[j], k);
				j += k;
				if (*st == '\0')
					more = FALSE;
				if (*st == '\\') {
					st++;
					state = 1;
				} else {
					repstr[j] = *st;
					j++;
					if (j >= REPLEN)
						return (FALSE);
					st++;
					state = 0;
				}
			}
			break;
		}		/* switch (state) */
	}			/* while (more)   */

	repstr[j] = '\0';
	s = lreplace(plen, repstr);
	return (s);
}